

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

bool __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::
compare(InvariantInnerTriangleSetTestInstance *this,PerPrimitiveVec *primitivesA,
       PerPrimitiveVec *primitivesB,int param_3)

{
  ulong uVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  float fVar4;
  TessPrimitiveType TVar5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pPVar8;
  undefined8 uVar9;
  TestLog *pTVar10;
  undefined1 auVar11 [4];
  bool bVar12;
  PerPrimitiveVec *pPVar13;
  long *plVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  float *pfVar17;
  long *plVar18;
  ulong uVar19;
  Vector<tcu::Vector<float,_3>,_3> *b;
  Vector<tcu::Vector<float,_3>,_3> *b_00;
  uint uVar20;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *psVar21;
  _Link_type p_Var22;
  _Link_type p_Var23;
  _Link_type p_Var24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *this_00;
  bool bVar28;
  bool bVar29;
  TriangleSet trianglesB;
  TriangleSet trianglesA;
  Triangle triangle;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  TestLog *local_250;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_248;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  *local_240;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_218;
  set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  local_1e8;
  undefined1 local_1b8 [4];
  float fStack_1b4;
  ostringstream aoStack_1b0 [4];
  float fStack_1ac;
  _Link_type local_1a8;
  _Base_ptr p_Stack_1a0;
  float local_198;
  undefined1 local_194 [84];
  ios_base local_140 [272];
  
  TVar5 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  uVar20 = 0;
  p_Var24 = (_Link_type)primitivesA;
  if (TVar5 == TESSPRIMITIVETYPE_QUADS) {
    pTVar10 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    local_240 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)(primitivesA->
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(primitivesA->
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    local_248 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)(primitivesB->
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(primitivesB->
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
    local_218._M_t._M_impl._0_1_ = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      psVar21 = local_248;
      if (uVar20 == 0) {
        psVar21 = local_240;
      }
      this_00 = &local_218;
      if (uVar20 == 0) {
        this_00 = &local_1e8;
      }
      uVar25 = (uint)((ulong)psVar21 >> 6);
      if (0 < (int)uVar25) {
        uVar26 = 0;
LAB_007be2ef:
        pPVar13 = primitivesB;
        if (uVar20 == 0) {
          pPVar13 = primitivesA;
        }
        pPVar6 = (pPVar13->
                 super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_1b8 = (undefined1  [4])pPVar6[uVar26].tessCoord[0].m_data[0];
        uVar9 = *(undefined8 *)(pPVar6[uVar26].tessCoord[0].m_data + 1);
        p_Var24 = *(_Link_type *)(pPVar6[uVar26].tessCoord[1].m_data + 1);
        p_Var15 = *(_Base_ptr *)pPVar6[uVar26].tessCoord[2].m_data;
        fStack_1b4 = (float)uVar9;
        aoStack_1b0 = SUB84((ulong)uVar9 >> 0x20,0);
        fStack_1ac = pPVar6[uVar26].tessCoord[1].m_data[0];
        local_1a8 = p_Var24;
        p_Stack_1a0 = p_Var15;
        local_198 = pPVar6[uVar26].tessCoord[2].m_data[2];
        if ((((float)local_1b8 != 0.0) || (NAN((float)local_1b8))) &&
           (((float)local_1b8 != 1.0 || (NAN((float)local_1b8))))) {
          bVar28 = false;
          uVar19 = 0;
          do {
            p_Var15 = (_Base_ptr)CONCAT71((int7)((ulong)p_Var15 >> 8),1);
            do {
              if ((char)p_Var15 == '\0') goto LAB_007be3be;
              p_Var24 = (_Link_type)((ulong)p_Var15 & 0xffffffff);
              fVar4 = (&fStack_1b4)[uVar19 * 3];
              if ((fVar4 == 0.0) && (!NAN(fVar4))) break;
              p_Var15 = (_Base_ptr)0x0;
            } while ((fVar4 != 1.0) || (NAN(fVar4)));
            if ((char)p_Var24 != '\0') goto LAB_007be3eb;
LAB_007be3be:
            uVar1 = uVar19 + 1;
            bVar28 = 1 < uVar19;
            if (uVar1 == 3) goto LAB_007be3eb;
            fVar4 = *(float *)(local_1b8 + uVar1 * 0xc);
            if (((fVar4 == 0.0) && (!NAN(fVar4))) ||
               ((uVar19 = uVar1, fVar4 == 1.0 && (!NAN(fVar4))))) goto LAB_007be3eb;
          } while( true );
        }
        goto LAB_007be422;
      }
LAB_007be42e:
      bVar28 = uVar20 == 0;
      uVar20 = uVar20 + 1;
    } while (bVar28);
    p_Var2 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &local_218._M_t._M_impl.super__Rb_tree_header;
    uVar20 = (uint)((_Rb_tree_header *)
                    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var3 &&
                   (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                   == p_Var2);
    if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3
        || (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var2) {
      bVar28 = (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var2;
      bVar29 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var3;
      p_Var15 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (!bVar28 && !bVar29) {
        while( true ) {
          p_Var24 = (_Link_type)(p_Var16 + 1);
          bVar12 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                             ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),
                              (Vector<tcu::Vector<float,_3>,_3> *)p_Var24);
          if (!bVar12) break;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          p_Var3 = &local_218._M_t._M_impl.super__Rb_tree_header;
          bVar28 = (_Rb_tree_header *)p_Var16 == p_Var3 && (_Rb_tree_header *)p_Var15 == p_Var2;
          uVar20 = (uint)bVar28;
          if (bVar28) goto LAB_007be9ed;
          bVar29 = (_Rb_tree_header *)p_Var16 == p_Var3;
          bVar28 = (_Rb_tree_header *)p_Var15 == p_Var2;
          if ((bVar28) || ((_Rb_tree_header *)p_Var16 == p_Var3)) break;
        }
      }
      local_1b8 = SUB84(pTVar10,0);
      auVar11 = local_1b8;
      fStack_1b4 = (float)((ulong)pTVar10 >> 0x20);
      fVar4 = fStack_1b4;
      std::__cxx11::ostringstream::ostringstream(aoStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1b0,
                 "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                 ,0x5a);
      local_238 = &local_228;
      local_230 = 0;
      local_228 = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_290 = &local_280;
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_280 = *plVar18;
        lStack_278 = plVar14[3];
      }
      else {
        local_280 = *plVar18;
        local_290 = (long *)*plVar14;
      }
      local_288 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_290);
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_260 = *plVar18;
        lStack_258 = plVar14[3];
        local_270 = &local_260;
      }
      else {
        local_260 = *plVar18;
        local_270 = (long *)*plVar14;
      }
      local_268 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1b0,(char *)local_270,local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1b0,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(aoStack_1b0);
      std::ios_base::~ios_base(local_140);
      if ((bVar28) ||
         ((!bVar29 &&
          (bVar28 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                    ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                  *)(p_Var15 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1),
                                 b_00), !bVar28)))) {
        local_1b8 = auVar11;
        fStack_1b4 = fVar4;
        std::__cxx11::ostringstream::ostringstream(aoStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)aoStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0," exists for second case but not for first",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b8 = auVar11;
        fStack_1b4 = fVar4;
        std::__cxx11::ostringstream::ostringstream(aoStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)aoStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0," exists for first case but not for second",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
LAB_007be9db:
      p_Var24 = (_Link_type)&std::__cxx11::ostringstream::VTT;
      std::__cxx11::ostringstream::~ostringstream(aoStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
  }
  else {
    if (TVar5 != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_007bea0a;
    local_250 = ((this->super_InvarianceTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    local_248 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)(primitivesA->
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(primitivesA->
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         )._M_impl.super__Vector_impl_data._M_start);
    pPVar6 = (primitivesB->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pPVar7 = (primitivesB->
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1e8._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1e8._M_t._M_impl._0_1_ = 0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_218._M_t._M_impl.super__Rb_tree_header._M_header;
    local_218._M_t._M_impl._0_1_ = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar27 = 0;
    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      psVar21 = (set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
                 *)((long)pPVar6 - (long)pPVar7);
      if (iVar27 == 0) {
        psVar21 = local_248;
      }
      local_240 = &local_218;
      if (iVar27 == 0) {
        local_240 = &local_1e8;
      }
      uVar20 = (uint)((ulong)psVar21 >> 6);
      if (0 < (int)uVar20) {
        uVar26 = 0;
        do {
          pPVar13 = primitivesB;
          if (iVar27 == 0) {
            pPVar13 = primitivesA;
          }
          pPVar8 = (pPVar13->
                   super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_1b8 = (undefined1  [4])pPVar8[uVar26].tessCoord[0].m_data[0];
          uVar9 = *(undefined8 *)(pPVar8[uVar26].tessCoord[0].m_data + 1);
          p_Var24 = *(_Link_type *)(pPVar8[uVar26].tessCoord[1].m_data + 1);
          fStack_1b4 = (float)uVar9;
          aoStack_1b0 = SUB84((ulong)uVar9 >> 0x20,0);
          fStack_1ac = pPVar8[uVar26].tessCoord[1].m_data[0];
          local_1a8 = p_Var24;
          p_Stack_1a0 = *(_Base_ptr *)pPVar8[uVar26].tessCoord[2].m_data;
          local_198 = pPVar8[uVar26].tessCoord[2].m_data[2];
          if (((float)local_1b8 != 0.0) || (NAN((float)local_1b8))) {
            bVar28 = false;
            pfVar17 = &fStack_1b4;
            p_Var22 = (_Link_type)0x0;
            do {
              p_Var23 = (_Link_type)0x0;
              do {
                p_Var24 = p_Var23;
                if (p_Var24 == (_Link_type)0x2) goto LAB_007be085;
                p_Var23 = (_Link_type)((long)&(p_Var24->super__Rb_tree_node_base)._M_color + 1);
              } while ((pfVar17[(long)p_Var24] != 0.0) || (NAN(pfVar17[(long)p_Var24])));
              if (p_Var24 < (_Link_type)0x2) break;
LAB_007be085:
              p_Var24 = (_Link_type)((long)&(p_Var22->super__Rb_tree_node_base)._M_color + 1);
              bVar28 = (_Link_type)&DAT_00000001 < p_Var22;
              if (p_Var24 == (_Link_type)0x3) break;
              pfVar17 = pfVar17 + 3;
              p_Var22 = p_Var24;
            } while ((*(float *)(local_1b8 + (long)p_Var24 * 0xc) != 0.0) ||
                    (NAN(*(float *)(local_1b8 + (long)p_Var24 * 0xc))));
            if (bVar28) {
              p_Var24 = (_Link_type)local_1b8;
              std::
              __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
                        (p_Var24,local_194);
              std::
              set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              ::insert(local_240,(value_type *)p_Var24);
            }
          }
          uVar26 = uVar26 + 1;
        } while (uVar26 != (uVar20 & 0x7fffffff));
      }
      bVar28 = iVar27 == 0;
      iVar27 = iVar27 + 1;
    } while (bVar28);
    p_Var2 = &local_1e8._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &local_218._M_t._M_impl.super__Rb_tree_header;
    uVar20 = (uint)((_Rb_tree_header *)
                    local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var3 &&
                   (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                   == p_Var2);
    if ((_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left != p_Var3
        || (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
           p_Var2) {
      bVar28 = (_Rb_tree_header *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var2;
      bVar29 = (_Rb_tree_header *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
               p_Var3;
      p_Var15 = local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var16 = local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (!bVar28 && !bVar29) {
        while( true ) {
          p_Var24 = (_Link_type)(p_Var16 + 1);
          bVar12 = tcu::Vector<tcu::Vector<float,_3>,_3>::operator==
                             ((Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1),
                              (Vector<tcu::Vector<float,_3>,_3> *)p_Var24);
          if (!bVar12) break;
          p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
          p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          p_Var3 = &local_218._M_t._M_impl.super__Rb_tree_header;
          bVar28 = (_Rb_tree_header *)p_Var16 == p_Var3 && (_Rb_tree_header *)p_Var15 == p_Var2;
          uVar20 = (uint)bVar28;
          if (bVar28) goto LAB_007be9ed;
          bVar29 = (_Rb_tree_header *)p_Var16 == p_Var3;
          bVar28 = (_Rb_tree_header *)p_Var15 == p_Var2;
          if ((bVar28) || ((_Rb_tree_header *)p_Var16 == p_Var3)) break;
        }
      }
      local_1b8 = SUB84(local_250,0);
      fStack_1b4 = (float)((ulong)local_250 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(aoStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1b0,
                 "Failure: triangle sets in two cases are not equal (when ignoring triangle and vertex order"
                 ,0x5a);
      local_238 = &local_228;
      local_230 = 0;
      local_228 = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_290 = &local_280;
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_280 = *plVar18;
        lStack_278 = plVar14[3];
      }
      else {
        local_280 = *plVar18;
        local_290 = (long *)*plVar14;
      }
      local_288 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_290);
      plVar18 = plVar14 + 2;
      if ((long *)*plVar14 == plVar18) {
        local_260 = *plVar18;
        lStack_258 = plVar14[3];
        local_270 = &local_260;
      }
      else {
        local_260 = *plVar18;
        local_270 = (long *)*plVar14;
      }
      local_268 = plVar14[1];
      *plVar14 = (long)plVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1b0,(char *)local_270,local_268);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)aoStack_1b0,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,local_280 + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(aoStack_1b0);
      std::ios_base::~ios_base(local_140);
      if ((bVar28) ||
         ((!bVar29 &&
          (bVar28 = LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                    ::operator()((LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>
                                  *)(p_Var15 + 1),(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1),
                                 b), !bVar28)))) {
        local_1b8 = SUB84(local_250,0);
        fStack_1b4 = (float)((ulong)local_250 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(aoStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)aoStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var16 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0," exists for second case but not for first",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b8 = SUB84(local_250,0);
        fStack_1b4 = (float)((ulong)local_250 >> 0x20);
        std::__cxx11::ostringstream::ostringstream(aoStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0,"Note: e.g. triangle ",0x14);
        tcu::operator<<((ostream *)aoStack_1b0,(Vector<tcu::Vector<float,_3>,_3> *)(p_Var15 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1b0," exists for first case but not for second",0x29);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      goto LAB_007be9db;
    }
  }
LAB_007be9ed:
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var24);
  std::
  _Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
  ::_M_erase((_Rb_tree<tcu::Vector<tcu::Vector<float,_3>,_3>,_tcu::Vector<tcu::Vector<float,_3>,_3>,_std::_Identity<tcu::Vector<tcu::Vector<float,_3>,_3>_>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
              *)local_1e8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,p_Var24);
LAB_007bea0a:
  return SUB41(uVar20,0);
LAB_007be3eb:
  if (bVar28) {
    p_Var24 = (_Link_type)local_1b8;
    std::
    __insertion_sort<tcu::Vector<float,3>*,__gnu_cxx::__ops::_Iter_comp_iter<vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>>>
              (p_Var24,local_194);
    std::
    set<tcu::Vector<tcu::Vector<float,_3>,_3>,_vkt::tessellation::(anonymous_namespace)::LexCompare<tcu::Vector<tcu::Vector<float,_3>,_3>,_3,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>_>,_std::allocator<tcu::Vector<tcu::Vector<float,_3>,_3>_>_>
    ::insert(this_00,(value_type *)p_Var24);
  }
LAB_007be422:
  uVar26 = uVar26 + 1;
  if (uVar26 == (uVar25 & 0x7fffffff)) goto LAB_007be42e;
  goto LAB_007be2ef;
}

Assistant:

bool compare (const PerPrimitiveVec& primitivesA, const PerPrimitiveVec& primitivesB, const int) const
	{
		if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerTriangleTriangle(), "outer triangles");
		else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
			return compareTriangleSets(primitivesA, primitivesB, m_context.getTestContext().getLog(), IsInnerQuadTriangle(), "outer triangles");
		else
		{
			DE_ASSERT(false);
			return false;
		}
	}